

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O2

void helics::valueExtract
               (data_view *data,DataType baseType,
               vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val)

{
  long lVar1;
  uint *puVar2;
  data_view *data_00;
  size_t ii;
  ulong uVar3;
  basic_string_view<char,_std::char_traits<char>_> val_00;
  string_view val_01;
  complex<double> cval;
  undefined1 local_60 [48];
  _Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> local_30;
  
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize(val,0);
  puVar2 = &switchD_00238bb9::switchdataD_0039d7bc;
  switch(baseType) {
  case HELICS_DOUBLE:
    local_60._0_8_ = ValueConverter<double>::interpret(data);
    goto LAB_00238cdc;
  case HELICS_INT:
    lVar1 = ValueConverter<long>::interpret(data);
    local_60._0_8_ = (undefined8)lVar1;
    goto LAB_00238cdc;
  case HELICS_COMPLEX:
    ValueConverter<std::complex<double>_>::interpret(data);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::push_back
              (val,(value_type *)local_60);
    break;
  case HELICS_VECTOR:
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret
              ((vector<double,_std::allocator<double>_> *)local_60,data);
    lVar1 = 0;
    for (uVar3 = 0; uVar3 < ((long)(local_60._8_8_ - local_60._0_8_) >> 3) - 1U; uVar3 = uVar3 + 2)
    {
      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
      emplace_back<double&,double&>
                ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)val,
                 (double *)(local_60._0_8_ + lVar1),(double *)(local_60._0_8_ + lVar1 + 8));
      lVar1 = lVar1 + 0x10;
    }
    if ((local_60._8_8_ - local_60._0_8_ & 8) != 0) {
      local_30._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
      emplace_back<double&,double>
                ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)val,
                 (double *)(local_60._8_8_ + -8),(double *)&local_30);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)local_60);
    break;
  case HELICS_COMPLEX_VECTOR:
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    interpret(data,val);
    return;
  case HELICS_NAMED_POINT:
    ValueConverter<helics::NamedPoint>::interpret((NamedPoint *)local_60,data);
    if (NAN((double)local_60._32_8_)) {
      val_01._M_str = (char *)puVar2;
      val_01._M_len = local_60._0_8_;
      helicsGetComplexVector
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_30,
                 (helics *)local_60._8_8_,val_01);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::_M_move_assign
                (val,&local_30);
      std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
                (&local_30);
    }
    else {
      local_30._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
      emplace_back<double&,double>
                ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)val,
                 (double *)(local_60 + 0x20),(double *)&local_30);
    }
    std::__cxx11::string::~string((string *)local_60);
    break;
  case HELICS_BOOL:
switchD_00238bb9_caseD_7:
    val_00 = ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::interpret(data)
    ;
    helicsGetComplexVector(val_00,val);
    return;
  case HELICS_TIME:
    lVar1 = ValueConverter<long>::interpret(data);
    local_60._0_8_ = (double)(lVar1 % 1000000000) * 1e-09 + (double)(lVar1 / 1000000000);
LAB_00238cdc:
    local_30._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
    emplace_back<double,double>
              ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)val,
               (double *)local_60,(double *)&local_30);
    break;
  default:
    if (baseType != HELICS_JSON) goto switchD_00238bb9_caseD_7;
    readJsonValue_abi_cxx11_((defV *)local_60,(helics *)data,data_00);
    valueExtract((defV *)local_60,val);
    std::__detail::__variant::
    _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)local_60);
  }
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, std::vector<std::complex<double>>& val)
{
    val.resize(0);
    switch (baseType) {
        case DataType::HELICS_DOUBLE: {
            val.emplace_back(ValueConverter<double>::interpret(data), 0.0);
            break;
        }
        case DataType::HELICS_INT: {
            val.emplace_back(static_cast<double>(ValueConverter<int64_t>::interpret(data)), 0.0);
            break;
        }
        case DataType::HELICS_TIME: {
            const Time time(ValueConverter<int64_t>::interpret(data), time_units::ns);
            val.emplace_back(static_cast<double>(time), 0.0);
        } break;
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default: {
            helicsGetComplexVector(ValueConverter<std::string_view>::interpret(data), val);
            break;
        }
        case DataType::HELICS_VECTOR: {
            auto vec = ValueConverter<std::vector<double>>::interpret(data);
            for (size_t ii = 0; ii < vec.size() - 1; ii += 2) {
                val.emplace_back(vec[ii], vec[ii + 1]);
            }
            if (vec.size() % 2 == 1) {
                val.emplace_back(vec.back(), 0.0);
            }

            break;
        }
        case DataType::HELICS_COMPLEX_VECTOR: {
            ValueConverter<std::vector<std::complex<double>>>::interpret(data, val);
            break;
        }
        case DataType::HELICS_NAMED_POINT: {
            auto npval = ValueConverter<NamedPoint>::interpret(data);
            if (std::isnan(npval.value)) {
                val = helicsGetComplexVector(npval.name);
            } else {
                val.emplace_back(npval.value, 0.0);
            }
            break;
        }
        case DataType::HELICS_COMPLEX: {
            auto cval = ValueConverter<std::complex<double>>::interpret(data);
            val.push_back(cval);
            break;
        }
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
    }
}